

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frontend_tester.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  FailStep FVar3;
  FailStep FVar4;
  ostream *poVar5;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_309;
  FailStep actualFailStep;
  undefined4 local_300;
  undefined1 local_2f8 [12];
  undefined1 local_2e8 [8];
  string contents;
  istream_type local_2c0 [8];
  ifstream file;
  allocator<char> local_b1;
  FailStep failStep;
  allocator<char> local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  string failStepString;
  string fileName;
  char **argv_local;
  int argc_local;
  
  if (argc == 3) {
    std::__cxx11::string::string((string *)(failStepString.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_58);
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,pcVar1,&local_79);
    std::__cxx11::string::operator=((string *)(failStepString.field_2._M_local_buf + 8),local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&failStep,pcVar1,&local_b1);
    std::__cxx11::string::operator=((string *)local_58,(string *)&failStep);
    std::__cxx11::string::~string((string *)&failStep);
    std::allocator<char>::~allocator(&local_b1);
    poVar5 = std::operator<<((ostream *)&std::cout,"Running file: ");
    poVar5 = std::operator<<(poVar5,(string *)(failStepString.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,(string *)local_58);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    FVar3 = failStepFromString((string *)local_58);
    std::ifstream::ifstream(local_2c0,(undefined1 *)((long)&failStepString.field_2 + 8),8);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) == 0) {
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2f8,local_2c0);
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)&actualFailStep);
      std::allocator<char>::allocator();
      __beg._12_4_ = 0;
      __beg._M_sbuf = (streambuf_type *)local_2f8._0_8_;
      __beg._M_c = local_2f8._8_4_;
      __end._12_4_ = 0;
      __end._M_sbuf = (streambuf_type *)_actualFailStep;
      __end._M_c = local_300;
      std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                ((string *)local_2e8,__beg,__end,&local_309);
      std::allocator<char>::~allocator(&local_309);
      FVar4 = run((string *)local_2e8);
      argv_local._4_4_ = (uint)(FVar4 != FVar3);
      contents.field_2._13_3_ = 0;
      contents.field_2._M_local_buf[0xc] = FVar4 != FVar3;
      std::__cxx11::string::~string((string *)local_2e8);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"file.fail is true, file may not exist! ");
      poVar5 = std::operator<<(poVar5,(string *)(failStepString.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,(string *)local_58);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      contents.field_2._12_4_ = 1;
    }
    std::ifstream::~ifstream(local_2c0);
    if (contents.field_2._12_4_ == 0) {
      argv_local._4_4_ = 0;
      contents.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)(failStepString.field_2._M_local_buf + 8));
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {

  if (argc != 3) {
    return 1;
  }

  std::string fileName;
  std::string failStepString;

  try {

    fileName = std::string{argv[1]};
    failStepString = std::string(argv[2]);

    std::cout << "Running file: " << fileName << " " << failStepString << std::endl;

    FailStep failStep = failStepFromString(failStepString);

    std::ifstream file{fileName};

    if (file.fail()) {
      std::cerr << "file.fail is true, file may not exist! " << fileName << " " << failStepString << std::endl;
      return 1;
    }

    std::string contents{std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>()};

    FailStep actualFailStep = run(contents);

    if (actualFailStep != failStep) {
      return 1;
    }

  } catch (...) {
    std::cerr << "Caught exception! " << fileName << " " << failStepString << std::endl;

    return 1;
  }

  return 0;
}